

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O3

void __thiscall TTD::SnapShot::SnapShot(SnapShot *this,double gcTime)

{
  SnapContext *pSVar1;
  int *piVar2;
  SnapRootInfoEntry *pSVar3;
  SnapHandler *pSVar4;
  SnapType *pSVar5;
  FunctionBodyResolveInfo *pFVar6;
  SnapPrimitiveValue *pSVar7;
  SnapObject *pSVar8;
  ScriptFunctionScopeInfo *pSVar9;
  SlotArrayInfo *pSVar10;
  SnapObjectVTable *pSVar11;
  
  SlabAllocatorBase<0>::SlabAllocatorBase(&this->m_slabAllocator,0x200000);
  (this->m_ctxList).m_alloc = &this->m_slabAllocator;
  pSVar1 = (SnapContext *)
           SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(&this->m_slabAllocator,0xe00);
  (this->m_ctxList).m_inlineHeadBlock.BlockData = pSVar1;
  (this->m_ctxList).m_inlineHeadBlock.CurrPos = pSVar1;
  (this->m_ctxList).m_inlineHeadBlock.EndPos = pSVar1 + 0x20;
  (this->m_ctxList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_tcSymbolRegistrationMapContents).m_alloc = &this->m_slabAllocator;
  piVar2 = (int *)SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(&this->m_slabAllocator,0x80);
  (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData = piVar2;
  (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos = piVar2;
  (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.EndPos = piVar2 + 0x20;
  (this->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  this->m_activeScriptContext = 0;
  (this->m_rootList).m_alloc = &this->m_slabAllocator;
  pSVar3 = (SnapRootInfoEntry *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x3000);
  (this->m_rootList).m_inlineHeadBlock.BlockData = pSVar3;
  (this->m_rootList).m_inlineHeadBlock.CurrPos = pSVar3;
  (this->m_rootList).m_inlineHeadBlock.EndPos = pSVar3 + 0x200;
  (this->m_rootList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_handlerList).m_alloc = &this->m_slabAllocator;
  pSVar4 = (SnapHandler *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x14000);
  (this->m_handlerList).m_inlineHeadBlock.BlockData = pSVar4;
  (this->m_handlerList).m_inlineHeadBlock.CurrPos = pSVar4;
  (this->m_handlerList).m_inlineHeadBlock.EndPos = pSVar4 + 0x800;
  (this->m_handlerList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_typeList).m_alloc = &this->m_slabAllocator;
  pSVar5 = (SnapType *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x18000);
  (this->m_typeList).m_inlineHeadBlock.BlockData = pSVar5;
  (this->m_typeList).m_inlineHeadBlock.CurrPos = pSVar5;
  (this->m_typeList).m_inlineHeadBlock.EndPos = pSVar5 + 0x800;
  (this->m_typeList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_functionBodyList).m_alloc = &this->m_slabAllocator;
  pFVar6 = (FunctionBodyResolveInfo *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x28000);
  (this->m_functionBodyList).m_inlineHeadBlock.BlockData = pFVar6;
  (this->m_functionBodyList).m_inlineHeadBlock.CurrPos = pFVar6;
  (this->m_functionBodyList).m_inlineHeadBlock.EndPos = pFVar6 + 0x800;
  (this->m_functionBodyList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_primitiveObjectList).m_alloc = &this->m_slabAllocator;
  pSVar7 = (SnapPrimitiveValue *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x20000);
  (this->m_primitiveObjectList).m_inlineHeadBlock.BlockData = pSVar7;
  (this->m_primitiveObjectList).m_inlineHeadBlock.CurrPos = pSVar7;
  (this->m_primitiveObjectList).m_inlineHeadBlock.EndPos = pSVar7 + 0x1000;
  (this->m_primitiveObjectList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_compoundObjectList).m_alloc = &this->m_slabAllocator;
  pSVar8 = (SnapObject *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x48000);
  (this->m_compoundObjectList).m_inlineHeadBlock.BlockData = pSVar8;
  (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos = pSVar8;
  (this->m_compoundObjectList).m_inlineHeadBlock.EndPos = pSVar8 + 0x1000;
  (this->m_compoundObjectList).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  this->m_snapObjectVTableArray = (SnapObjectVTable *)0x0;
  (this->m_scopeEntries).m_alloc = &this->m_slabAllocator;
  pSVar9 = (ScriptFunctionScopeInfo *)
           SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x10000);
  (this->m_scopeEntries).m_inlineHeadBlock.BlockData = pSVar9;
  (this->m_scopeEntries).m_inlineHeadBlock.CurrPos = pSVar9;
  (this->m_scopeEntries).m_inlineHeadBlock.EndPos = pSVar9 + 0x800;
  (this->m_scopeEntries).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  (this->m_slotArrayEntries).m_alloc = &this->m_slabAllocator;
  pSVar10 = (SlotArrayInfo *)
            SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<true>(&this->m_slabAllocator,0x24000);
  (this->m_slotArrayEntries).m_inlineHeadBlock.BlockData = pSVar10;
  (this->m_slotArrayEntries).m_inlineHeadBlock.CurrPos = pSVar10;
  (this->m_slotArrayEntries).m_inlineHeadBlock.EndPos = pSVar10 + 0x800;
  (this->m_slotArrayEntries).m_inlineHeadBlock.Next = (UnorderedArrayListLink *)0x0;
  this->GCTime = gcTime;
  this->MarkTime = 0.0;
  this->ExtractTime = 0.0;
  pSVar11 = (SnapObjectVTable *)
            SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(&this->m_slabAllocator,0x540);
  this->m_snapObjectVTableArray = pSVar11;
  memset(pSVar11,0,0x540);
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11->InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar11->AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11->EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11->ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[1].InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar11[1].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[1].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11[1].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[2].InflationFunc = NSSnapObjects::DoObjectInflation_SnapDynamicObject;
  pSVar11[2].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[2].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[2].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x26].InflationFunc = NSSnapObjects::DoObjectInflation_SnapAwaitObject;
  pSVar11[0x26].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[0x26].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x26].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[3].InflationFunc = NSSnapObjects::DoObjectInflation_SnapExternalObject;
  pSVar11[3].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[3].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[3].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[4].InflationFunc = NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo;
  pSVar11[4].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo;
  pSVar11[4].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo;
  pSVar11[4].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[5].InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar11[5].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[5].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11[5].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[6].InflationFunc = NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo;
  pSVar11[6].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[6].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo;
  pSVar11[6].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[7].InflationFunc = NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo;
  pSVar11[7].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[7].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo;
  pSVar11[7].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[8].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo;
  pSVar11[8].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[8].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo;
  pSVar11[8].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[9].InflationFunc = NSSnapObjects::DoObjectInflation_SnapActivationInfo;
  pSVar11[9].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[9].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[9].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[10].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBlockActivationObject;
  pSVar11[10].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[10].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[10].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0xb].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject;
  pSVar11[0xb].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[0xb].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0xb].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0xc].InflationFunc = NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject;
  pSVar11[0xc].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[0xc].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0xc].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0xd].InflationFunc = NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo;
  pSVar11[0xd].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0xd].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  pSVar11[0xd].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0xe].InflationFunc = NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo;
  pSVar11[0xe].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0xe].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  pSVar11[0xe].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0xf].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBoxedValue;
  pSVar11[0xf].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue;
  pSVar11[0xf].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapBoxedValue;
  pSVar11[0xf].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapBoxedValue;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x10].InflationFunc = NSSnapObjects::DoObjectInflation_SnapDate;
  pSVar11[0x10].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x10].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapDate;
  pSVar11[0x10].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapDate;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x11].InflationFunc = NSSnapObjects::DoObjectInflation_SnapRegexInfo;
  pSVar11[0x11].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x11].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapRegexInfo;
  pSVar11[0x11].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapRegexInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x12].InflationFunc = NSSnapObjects::DoObjectInflation_SnapError;
  pSVar11[0x12].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  pSVar11[0x12].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x12].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x13].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar11[0x13].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<void*,void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar11[0x13].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar11[0x13].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x14].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar11[0x14].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<int,int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar11[0x14].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar11[0x14].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x15].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  pSVar11[0x15].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<double,double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  pSVar11[0x15].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  pSVar11[0x15].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x16].InflationFunc = NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo;
  pSVar11[0x16].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo;
  pSVar11[0x16].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo;
  pSVar11[0x16].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x17].InflationFunc = NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo;
  pSVar11[0x17].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x17].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo;
  pSVar11[0x17].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x18].InflationFunc = NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo;
  pSVar11[0x18].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x18].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo;
  pSVar11[0x18].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x19].InflationFunc = NSSnapObjects::DoObjectInflation_SnapSetInfo;
  pSVar11[0x19].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo;
  pSVar11[0x19].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapSetInfo;
  pSVar11[0x19].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapSetInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x1a].InflationFunc = NSSnapObjects::DoObjectInflation_SnapMapInfo;
  pSVar11[0x1a].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo;
  pSVar11[0x1a].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapMapInfo;
  pSVar11[0x1a].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapMapInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x1b].InflationFunc = NSSnapObjects::DoObjectInflation_SnapProxyInfo;
  pSVar11[0x1b].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x1b].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapProxyInfo;
  pSVar11[0x1b].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapProxyInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x1c].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPromiseInfo;
  pSVar11[0x1c].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x1c].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo;
  pSVar11[0x1c].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x1d].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar11[0x1d].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x1d].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar11[0x1d].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x1e].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo
  ;
  pSVar11[0x1e].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x1e].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo
  ;
  pSVar11[0x1e].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x1f].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo;
  pSVar11[0x1f].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x1f].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  pSVar11[0x1f].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x22].InflationFunc = NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo;
  pSVar11[0x22].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo;
  pSVar11[0x22].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo;
  pSVar11[0x22].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x23].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar11[0x23].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar11[0x23].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar11[0x23].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x24].InflationFunc = NSSnapObjects::DoObjectInflation_SnapAsyncFunction;
  pSVar11[0x24].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction
  ;
  pSVar11[0x24].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction;
  pSVar11[0x24].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x25].InflationFunc = NSSnapObjects::DoObjectInflation_SnapGeneratorInfo;
  pSVar11[0x25].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo
  ;
  pSVar11[0x25].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo;
  pSVar11[0x25].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x28].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar11[0x28].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar11[0x28].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar11[0x28].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar11 = this->m_snapObjectVTableArray;
  pSVar11[0x29].InflationFunc = (fPtr_DoObjectInflation)0x0;
  pSVar11[0x29].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar11[0x29].EmitAddtlInfoFunc = (fPtr_EmitAddtlInfo)0x0;
  pSVar11[0x29].ParseAddtlInfoFunc = (fPtr_ParseAddtlInfo)0x0;
  return;
}

Assistant:

SnapShot::SnapShot(double gcTime)
        : m_slabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_LARGE),
        m_ctxList(&this->m_slabAllocator), m_tcSymbolRegistrationMapContents(&this->m_slabAllocator), m_activeScriptContext(TTD_INVALID_LOG_PTR_ID),
        m_rootList(&this->m_slabAllocator),
        m_handlerList(&this->m_slabAllocator), m_typeList(&this->m_slabAllocator),
        m_functionBodyList(&this->m_slabAllocator), m_primitiveObjectList(&this->m_slabAllocator), m_compoundObjectList(&this->m_slabAllocator),
        m_scopeEntries(&this->m_slabAllocator), m_slotArrayEntries(&this->m_slabAllocator),
        m_snapObjectVTableArray(nullptr),
        GCTime(gcTime), MarkTime(0.0), ExtractTime(0.0)
    {
        this->m_snapObjectVTableArray = this->m_slabAllocator.SlabAllocateArray<NSSnapObjects::SnapObjectVTable>((uint32)NSSnapObjects::SnapObjectType::Limit);
        memset(this->m_snapObjectVTableArray, 0, sizeof(NSSnapObjects::SnapObjectVTable) * (uint32)NSSnapObjects::SnapObjectType::Limit);

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::Invalid] = { nullptr, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapUnhandledObject] = { nullptr, nullptr, nullptr, nullptr };

        ////
        //For the objects that have inflators

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapDynamicObject] = { &NSSnapObjects::DoObjectInflation_SnapDynamicObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapAwaitObject] = { &NSSnapObjects::DoObjectInflation_SnapAwaitObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapExternalObject] = { &NSSnapObjects::DoObjectInflation_SnapExternalObject, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapScriptFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo, &NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject] = { nullptr, nullptr, nullptr, nullptr }; //should always be wellknown objects and the extra state is in the functionbody defs
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapExternalFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRuntimeRevokerFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBoundFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapActivationInfo, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBlockActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapBlockActivationObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPseudoActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapConsoleScopeActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject] = { &NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject>, &NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject] = { &NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject>, &NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject> };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBoxedValueObject] = { &NSSnapObjects::DoObjectInflation_SnapBoxedValue, &NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue, &NSSnapObjects::EmitAddtlInfo_SnapBoxedValue, &NSSnapObjects::ParseAddtlInfo_SnapBoxedValue };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapDateObject] = { &NSSnapObjects::DoObjectInflation_SnapDate, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapDate, &NSSnapObjects::ParseAddtlInfo_SnapDate };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRegexObject] = { &NSSnapObjects::DoObjectInflation_SnapRegexInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapRegexInfo, &NSSnapObjects::ParseAddtlInfo_SnapRegexInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapErrorObject] = { &NSSnapObjects::DoObjectInflation_SnapError, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<Js::Var, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<TTDVar, Js::Var, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<TTDVar, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<TTDVar, NSSnapObjects::SnapObjectType::SnapArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<int32, int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<double, double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapES5ArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo, &NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo, &NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapArrayBufferObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo, &NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapTypedArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo, &NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapSetObject] = { &NSSnapObjects::DoObjectInflation_SnapSetInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo, &NSSnapObjects::EmitAddtlInfo_SnapSetInfo, &NSSnapObjects::ParseAddtlInfo_SnapSetInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapMapObject] = { &NSSnapObjects::DoObjectInflation_SnapMapInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo, &NSSnapObjects::EmitAddtlInfo_SnapMapInfo, &NSSnapObjects::ParseAddtlInfo_SnapMapInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapProxyObject] = { &NSSnapObjects::DoObjectInflation_SnapProxyInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapProxyInfo, &NSSnapObjects::ParseAddtlInfo_SnapProxyInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseResolveOrRejectFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseAllResolveElementFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGeneratorFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGeneratorVirtualScriptFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapAsyncFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapAsyncFunction,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction,
            &NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction,
            &NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction
        };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGenerator] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::JavascriptAsyncSpawnStepFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo
        };



        ////
        //For the objects that are always well known

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapWellKnownObject] = { nullptr, nullptr, nullptr, nullptr };
    }